

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clause.cpp
# Opt level: O0

uint32 __thiscall
Clasp::LoopFormula::isOpen(LoopFormula *this,Solver *s,TypeSet *xs,LitVec *freeLits)

{
  bool bVar1;
  ValueRep VVar2;
  Literal *this_00;
  Literal *pLVar3;
  Set *in_RDX;
  Solver *in_RSI;
  LoopFormula *in_RDI;
  Literal *end;
  Literal *it_1;
  Literal *it;
  Var in_stack_ffffffffffffff9c;
  Solver *in_stack_ffffffffffffffa0;
  Solver *this_01;
  Solver *in_stack_ffffffffffffffa8;
  Solver *in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  Literal *local_30;
  uint32 local_4;
  
  bVar1 = Constraint_t::Set::inSet(in_RDX,Loop);
  if ((!bVar1) ||
     (bVar1 = otherIsSat((LoopFormula *)
                         CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                         in_stack_ffffffffffffffc0), bVar1)) {
    local_4 = 0;
  }
  else {
    local_30 = begin(in_RDI);
    local_30 = local_30 + (int)(*(uint *)&in_RDI->field_0x10 >> 0x1f);
    while (bVar1 = isSentinel((Literal)0x0), ((bVar1 ^ 0xffU) & 1) != 0) {
      in_stack_ffffffffffffffa8 = in_RSI;
      Literal::var(local_30);
      VVar2 = Solver::value(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c);
      if (VVar2 == '\0') {
        bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::push_back
                  ((pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_> *)in_RDI,
                   (Literal *)in_stack_ffffffffffffffa8);
      }
      else {
        bVar1 = Solver::isTrue(in_stack_ffffffffffffffa8,(Literal)(uint32)((ulong)in_RDI >> 0x20));
        if (bVar1) {
          in_RDI->other_ = (uint32)((long)local_30 - (long)(in_RDI + 1) >> 2);
          return 0;
        }
      }
      local_30 = local_30 + 1;
    }
    this_00 = xBegin(in_RDI);
    pLVar3 = xEnd(in_RDI);
    for (; this_00 != pLVar3; this_00 = this_00 + 1) {
      this_01 = in_RSI;
      Literal::var(this_00);
      VVar2 = Solver::value(this_01,in_stack_ffffffffffffff9c);
      if (VVar2 == '\0') {
        bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::push_back
                  ((pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_> *)in_RDI,
                   (Literal *)in_stack_ffffffffffffffa8);
      }
    }
    local_4 = 2;
  }
  return local_4;
}

Assistant:

uint32 LoopFormula::isOpen(const Solver& s, const TypeSet& xs, LitVec& freeLits) {
	if (!xs.inSet(Constraint_t::Loop) || otherIsSat(s)) {
		return 0;
	}
	for (Literal* it = begin() + xPos_; !isSentinel(*it); ++it) {
		if      (s.value(it->var()) == value_free) { freeLits.push_back(*it); }
		else if (s.isTrue(*it))                    { other_ = static_cast<uint32>(it-lits_); return 0; }
	}
	for (Literal* it = xBegin(), *end = xEnd(); it != end; ++it) {
		if (s.value(it->var()) == value_free) { freeLits.push_back(*it); }
	}
	return Constraint_t::Loop;
}